

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

bool DynamicProfileStorage::AcquireLock(void)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  undefined4 *puVar4;
  
  if (mutex == (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x2bd,"(mutex != nullptr)","mutex != nullptr");
    if (!bVar2) goto LAB_0097e202;
    *puVar4 = 0;
  }
  if (locked == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x2be,"(!locked)","!locked");
    if (!bVar2) {
LAB_0097e202:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  DVar3 = WaitForSingleObject(mutex,0xffffffff);
  if ((DVar3 & 0xffffff7f) == 0) {
    locked = true;
  }
  else {
    Output::Print(L"ERROR: DynamicProfileStorage: Unable to acquire mutex %d\n",(ulong)DVar3);
    Output::Flush();
    DisableCacheDir();
  }
  return (DVar3 & 0xffffff7f) == 0;
}

Assistant:

bool DynamicProfileStorage::AcquireLock()
{
    AssertOrFailFast(mutex != nullptr);
    AssertOrFailFast(!locked);
    DWORD ret = WaitForSingleObject(mutex, INFINITE);
    if (ret == WAIT_OBJECT_0 || ret == WAIT_ABANDONED)
    {
#if DBG
        locked = true;
#endif
        return true;
    }
    Output::Print(_u("ERROR: DynamicProfileStorage: Unable to acquire mutex %d\n"), ret);
    Output::Flush();
    DisableCacheDir();

    return false;
}